

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_74304a::HandleFilesMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  PolicyStatus PVar4;
  string *psVar5;
  const_iterator cVar6;
  undefined4 extraout_var;
  ostream *poVar7;
  size_t sVar8;
  cmGlobalGenerator *this;
  char *pcVar9;
  pointer pbVar10;
  static_string_view name;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  undefined1 auVar11 [12];
  string type;
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  files;
  Helper helper;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  absFiles;
  string destination;
  cmInstallCommandArguments ica;
  string local_4b0;
  undefined4 local_490;
  MessageType local_48c;
  cmExecutionStatus *local_488;
  int local_47c;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_478;
  string local_470;
  uint local_44c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_448;
  undefined8 local_430;
  string *local_428;
  cmGlobalGenerator *local_420;
  Helper local_418;
  string local_3e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a8;
  string local_390;
  char *local_370;
  undefined8 local_368;
  size_type local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_358;
  undefined8 local_350;
  undefined8 local_348;
  char *local_340;
  undefined8 local_338;
  ios_base local_320 [264];
  ParseResult local_218;
  cmInstallCommandArguments local_1e8;
  
  local_488 = status;
  Helper::Helper(&local_418,status);
  local_47c = std::__cxx11::string::compare
                        ((char *)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3e8,local_418.DefaultComponentName._M_dataplus._M_p,
             local_418.DefaultComponentName._M_dataplus._M_p +
             local_418.DefaultComponentName._M_string_length);
  cmInstallCommandArguments::cmInstallCommandArguments(&local_1e8,&local_3e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  local_448.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_448.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_448.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar9 = "FILES";
  if (local_47c == 0) {
    pcVar9 = "PROGRAMS";
  }
  name.super_string_view._M_len = (ulong)(local_47c == 0) * 3 + 5;
  name.super_string_view._M_str = pcVar9;
  cmArgumentParser<void>::
  Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_1e8.super_cmArgumentParser<void>,name,
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_448);
  local_3c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_218,&local_1e8.super_cmArgumentParser<void>,args,&local_3c8,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_218);
  if (local_3c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_3c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_390._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
    local_390._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
    local_390.field_2._M_allocated_capacity = 0;
    local_390.field_2._8_8_ = 0x19;
    local_370 = " given unknown argument \"";
    local_368 = 0;
    local_358 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((local_3c8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_360 = (local_3c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    local_350 = 0;
    local_348 = 2;
    local_340 = "\".";
    local_338 = 0;
    views._M_len = 4;
    views._M_array = (iterator)&local_390;
    cmCatViews(&local_470,views);
    std::__cxx11::string::_M_assign((string *)&local_488->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
    goto LAB_00258ae4;
  }
  psVar5 = cmInstallCommandArguments::GetType_abi_cxx11_(&local_1e8);
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_470,pcVar1,pcVar1 + psVar5->_M_string_length);
  if ((local_470._M_string_length == 0) ||
     (cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(anonymous_namespace)::allowedTypes_abi_cxx11_,&local_470),
     cVar6._M_node != (_Base_ptr)((anonymous_namespace)::allowedTypes_abi_cxx11_ + 8))) {
    if (local_448.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_448.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar3 = true;
    }
    else {
      psVar5 = cmInstallCommandArguments::GetRename_abi_cxx11_(&local_1e8);
      if ((psVar5->_M_string_length != 0) &&
         (0x20 < (ulong)((long)local_448.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_448.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start))) {
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_390._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
        local_390._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
        local_390.field_2._M_allocated_capacity = 0;
        local_390.field_2._8_8_ = 0x2d;
        local_370 = " given RENAME option with more than one file.";
        local_368 = 0;
        views_00._M_len = 2;
        views_00._M_array = (iterator)&local_390;
        cmCatViews(&local_4b0,views_00);
        std::__cxx11::string::_M_assign((string *)&local_488->Error);
        goto LAB_00258992;
      }
      local_3a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar3 = Helper::MakeFilesFullPath
                        (&local_418,
                         (((args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,&local_448
                         ,&local_3a8);
      if (bVar3) {
        PVar4 = cmMakefile::GetPolicyStatus(local_418.Makefile,CMP0062,false);
        local_430 = CONCAT44(extraout_var,PVar4);
        local_420 = cmMakefile::GetGlobalGenerator(local_418.Makefile);
        local_428 = local_448.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (local_448.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_448.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_44c = (int)local_430 - 2;
          pbVar10 = local_448.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            bVar3 = cmGlobalGenerator::IsExportedTargetsFile(local_420,pbVar10);
            if (bVar3) {
              auVar11 = std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_390);
              if (local_44c < 3) {
                local_48c = FATAL_ERROR;
                local_490 = (undefined4)CONCAT71(auVar11._1_7_,1);
                bVar3 = false;
                pcVar9 = "may";
              }
              else {
                if ((int)local_430 == 1) {
                  cmPolicies::GetPolicyWarning_abi_cxx11_
                            (&local_4b0,(cmPolicies *)0x3e,auVar11._8_4_);
                  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&local_390,local_4b0._M_dataplus._M_p,
                                      local_4b0._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
                    operator_delete(local_4b0._M_dataplus._M_p,
                                    local_4b0.field_2._M_allocated_capacity + 1);
                  }
                  bVar3 = false;
                  pcVar9 = "should";
                }
                else {
                  pcVar9 = (char *)0x0;
                  bVar3 = true;
                }
                local_490 = 0;
                local_48c = AUTHOR_WARNING;
              }
              if (!bVar3) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_390,"The file\n  ",0xb);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&local_390,(pbVar10->_M_dataplus)._M_p,
                                    pbVar10->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,"\nwas generated by the export() command.  It ",0x2c);
                sVar8 = strlen(pcVar9);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar9,sVar8);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,
                           " not be installed with the install() command.  Use the install(EXPORT) mechanism instead.  See the cmake-packages(7) manual for more.\n"
                           ,0x86);
                pcVar2 = local_418.Makefile;
                std::__cxx11::stringbuf::str();
                cmMakefile::IssueMessage(pcVar2,local_48c,&local_4b0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
                  operator_delete(local_4b0._M_dataplus._M_p,
                                  local_4b0.field_2._M_allocated_capacity + 1);
                }
                if ((char)local_490 != '\0') {
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_390);
                  std::ios_base::~ios_base(local_320);
                  goto LAB_00258ab8;
                }
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_390);
              std::ios_base::~ios_base(local_320);
            }
            pbVar10 = pbVar10 + 1;
          } while (pbVar10 != local_428);
        }
        bVar3 = cmInstallCommandArguments::Finalize(&local_1e8);
        if (!bVar3) goto LAB_00258ab8;
        if ((local_470._M_string_length != 0) &&
           (psVar5 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&local_1e8),
           psVar5->_M_string_length != 0)) {
          cmStrCat<std::__cxx11::string_const&,char_const(&)[70]>
                    (&local_390,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (char (*) [70])
                     " given both TYPE and DESTINATION arguments. You may only specify one.");
          std::__cxx11::string::_M_assign((string *)&local_488->Error);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._M_dataplus._M_p != &local_390.field_2) {
            operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00258ab8;
        }
        Helper::GetDestinationForType(&local_390,&local_418,&local_1e8,&local_470);
        pcVar2 = local_418.Makefile;
        bVar3 = (pointer)local_390._M_string_length != (pointer)0x0;
        if ((pointer)local_390._M_string_length == (pointer)0x0) {
          cmStrCat<std::__cxx11::string_const&,char_const(&)[23]>
                    (&local_4b0,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (char (*) [23])" given no DESTINATION!");
          std::__cxx11::string::_M_assign((string *)&local_488->Error);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
            operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          CreateInstallFilesGenerator
                    ((anon_unknown_dwarf_74304a *)&local_4b0,local_418.Makefile,&local_3a8,
                     &local_1e8,local_47c == 0,&local_390);
          local_478._M_head_impl = (cmInstallGenerator *)local_4b0._M_dataplus._M_p;
          local_4b0._M_dataplus._M_p = (pointer)0x0;
          cmMakefile::AddInstallGenerator
                    (pcVar2,(unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                             *)&local_478);
          if (local_478._M_head_impl != (cmInstallGenerator *)0x0) {
            (*((local_478._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
          }
          local_478._M_head_impl = (cmInstallGenerator *)0x0;
          if ((long *)local_4b0._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_4b0._M_dataplus._M_p + 8))();
          }
          this = cmMakefile::GetGlobalGenerator(local_418.Makefile);
          psVar5 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&local_1e8);
          cmGlobalGenerator::AddInstallComponent(this,psVar5);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != &local_390.field_2) {
          operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
        }
      }
      else {
LAB_00258ab8:
        bVar3 = false;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3a8);
    }
  }
  else {
    pbVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_390._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
    local_390._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
    local_390.field_2._M_allocated_capacity = 0;
    local_390.field_2._8_8_ = 0x11;
    local_370 = " given non-type \"";
    local_368 = 0;
    local_360 = local_470._M_string_length;
    local_358 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_470._M_dataplus._M_p;
    local_350 = 0;
    local_348 = 0x15;
    local_340 = "\" with TYPE argument.";
    local_338 = 0;
    views_01._M_len = 4;
    views_01._M_array = (iterator)&local_390;
    cmCatViews(&local_4b0,views_01);
    std::__cxx11::string::_M_assign((string *)&local_488->Error);
LAB_00258992:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
LAB_00258ae4:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_448);
  cmInstallCommandArguments::~cmInstallCommandArguments(&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418.DefaultComponentName._M_dataplus._M_p != &local_418.DefaultComponentName.field_2)
  {
    operator_delete(local_418.DefaultComponentName._M_dataplus._M_p,
                    local_418.DefaultComponentName.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool HandleFilesMode(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  Helper helper(status);

  // This is the FILES mode.
  bool programs = (args[0] == "PROGRAMS");
  cmInstallCommandArguments ica(helper.DefaultComponentName);
  ArgumentParser::MaybeEmpty<std::vector<std::string>> files;
  ica.Bind(programs ? "PROGRAMS"_s : "FILES"_s, files);
  std::vector<std::string> unknownArgs;
  ica.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    status.SetError(
      cmStrCat(args[0], " given unknown argument \"", unknownArgs[0], "\"."));
    return false;
  }

  std::string type = ica.GetType();
  if (!type.empty() && allowedTypes.count(type) == 0) {
    status.SetError(
      cmStrCat(args[0], " given non-type \"", type, "\" with TYPE argument."));
    return false;
  }

  const std::vector<std::string>& filesVector = files;

  // Check if there is something to do.
  if (filesVector.empty()) {
    return true;
  }

  if (!ica.GetRename().empty() && filesVector.size() > 1) {
    // The rename option works only with one file.
    status.SetError(
      cmStrCat(args[0], " given RENAME option with more than one file."));
    return false;
  }

  std::vector<std::string> absFiles;
  if (!helper.MakeFilesFullPath(args[0].c_str(), filesVector, absFiles)) {
    return false;
  }

  cmPolicies::PolicyStatus policyStatus =
    helper.Makefile->GetPolicyStatus(cmPolicies::CMP0062);

  cmGlobalGenerator* gg = helper.Makefile->GetGlobalGenerator();
  for (std::string const& file : filesVector) {
    if (gg->IsExportedTargetsFile(file)) {
      const char* modal = nullptr;
      std::ostringstream e;
      MessageType messageType = MessageType::AUTHOR_WARNING;

      switch (policyStatus) {
        case cmPolicies::WARN:
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0062) << "\n";
          modal = "should";
          CM_FALLTHROUGH;
        case cmPolicies::OLD:
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          modal = "may";
          messageType = MessageType::FATAL_ERROR;
          break;
      }
      if (modal) {
        e << "The file\n  " << file
          << "\nwas generated by the export() "
             "command.  It "
          << modal
          << " not be installed with the "
             "install() command.  Use the install(EXPORT) mechanism "
             "instead.  See the cmake-packages(7) manual for more.\n";
        helper.Makefile->IssueMessage(messageType, e.str());
        if (messageType == MessageType::FATAL_ERROR) {
          return false;
        }
      }
    }
  }

  if (!ica.Finalize()) {
    return false;
  }

  if (!type.empty() && !ica.GetDestination().empty()) {
    status.SetError(cmStrCat(args[0],
                             " given both TYPE and DESTINATION arguments. "
                             "You may only specify one."));
    return false;
  }

  std::string destination = helper.GetDestinationForType(&ica, type);
  if (destination.empty()) {
    // A destination is required.
    status.SetError(cmStrCat(args[0], " given no DESTINATION!"));
    return false;
  }

  // Create the files install generator.
  helper.Makefile->AddInstallGenerator(CreateInstallFilesGenerator(
    helper.Makefile, absFiles, ica, programs, destination));

  // Tell the global generator about any installation component names
  // specified.
  helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
    ica.GetComponent());

  return true;
}